

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

void __thiscall
data_structures::Matrix<double>::Matrix(Matrix<double> *this,size_t rows,size_t columns)

{
  this->rows_ = rows;
  this->columns_ = columns;
  (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&this->data_,rows * columns);
  return;
}

Assistant:

Matrix<ElementType>::Matrix(size_t rows, size_t columns)
  : rows_(rows), columns_(columns)
{
  data_.resize(rows_ * columns_);
}